

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall Palette::Palette(Palette *this)

{
  map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *this_00;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Palette *local_10;
  Palette *this_local;
  
  local_10 = this;
  this_00 = (map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *)
            operator_new(0x30);
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->_M_t)._M_impl = 0;
  *(undefined8 *)&(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  std::map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>::map
            (this_00);
  this->colours = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Green",&local_31);
  setColour(this,0,&local_30,0xaaff00);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Orange",&local_69);
  setColour(this,1,&local_68,0xffaa00);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"Pink",&local_91);
  setColour(this,2,&local_90,0xff00aa);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"Purple",&local_b9);
  setColour(this,3,&local_b8,0xaa00ff);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"Blue",&local_e1);
  setColour(this,4,&local_e0,0xaaff);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"Red",&local_109);
  setColour(this,5,&local_108,0xff0036);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"Yellow",&local_131);
  setColour(this,6,&local_130,0xfff000);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"Black",&local_159);
  setColour(this,7,&local_158,0);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"White",&local_181);
  setColour(this,8,&local_180,0xffffff);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"Grey",&local_1a9);
  setColour(this,9,&local_1a8,0x999999);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"Navy",&local_1d1);
  setColour(this,10,&local_1d0,0x71865);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  return;
}

Assistant:

Palette::Palette() {
    colours = new map<int, Colour*>();
    setColour(GREEN, "Green", 0xAAFF00);
    setColour(ORANGE, "Orange", 0xFFAA00);
    setColour(PINK, "Pink", 0xFF00AA);
    setColour(PURPLE, "Purple", 0xAA00FF);
    setColour(BLUE, "Blue", 0x00AAFF);
    setColour(RED, "Red", 0xFF0036);
    setColour(YELLOW, "Yellow", 0xFFF000);
    setColour(BLACK, "Black", 0x000000);
    setColour(WHITE, "White", 0xFFFFFF);
    setColour(GREY, "Grey", 0x999999);
    setColour(NAVY, "Navy", 0x071865);
}